

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::value::TryGetUnderlyingTypeName_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,value *this,uint32_t tyid)

{
  undefined8 *puVar1;
  anon_struct_8_0_00000001_for___align *paVar2;
  compare_key_type compare_key;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint *__dest;
  map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> utynamemap;
  allocator local_1a1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  uint local_178 [88];
  
  __dest = local_178;
  memcpy(__dest,&DAT_00299748,0x160);
  uVar3 = (uint)this & 0xffefffff;
  uVar6 = 0x16;
  do {
    uVar4 = uVar6 >> 1;
    uVar5 = uVar4;
    if (__dest[uVar4 * 4] < uVar3) {
      uVar5 = ~uVar4 + uVar6;
      __dest = __dest + uVar4 * 4 + 4;
    }
    uVar6 = uVar5;
  } while (uVar5 != 0);
  if ((__dest == (uint *)&stack0xffffffffffffffe8) || (uVar3 < *__dest)) {
    TryGetTypeName_abi_cxx11_(&local_1a0,(value *)((ulong)this & 0xffffffff),0);
    __return_storage_ptr__->has_value_ = local_1a0.has_value_;
    if (local_1a0.has_value_ != true) {
      return __return_storage_ptr__;
    }
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x10);
    *(undefined8 **)&__return_storage_ptr__->contained = puVar1;
    if (local_1a0.contained.data.__align ==
        (anon_struct_8_0_00000001_for___align)((long)&local_1a0.contained + 0x10)) {
      *puVar1 = local_1a0.contained._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_1a0.contained._24_8_;
      local_1a0.contained._0_8_ = local_1a0.contained._8_8_;
    }
    else {
      *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
           local_1a0.contained.data.__align;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_1a0.contained._16_8_;
      local_1a0.contained._0_8_ = local_1a0.contained._8_8_;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_1a0,*(char **)(__dest + 2),&local_1a1);
    if (((uint)this >> 0x14 & 1) != 0) {
      std::__cxx11::string::append(&local_1a0.has_value_);
    }
    __return_storage_ptr__->has_value_ = true;
    paVar2 = (anon_struct_8_0_00000001_for___align *)
             ((long)&__return_storage_ptr__->contained + 0x10);
    *(anon_struct_8_0_00000001_for___align **)&__return_storage_ptr__->contained = paVar2;
    if ((undefined1 *)CONCAT71(local_1a0._1_7_,local_1a0.has_value_) ==
        (undefined1 *)((long)&local_1a0.contained + 8)) {
      *paVar2 = (anon_struct_8_0_00000001_for___align)local_1a0.contained._8_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_1a0.contained._16_8_;
    }
    else {
      *(undefined1 **)&__return_storage_ptr__->contained =
           (undefined1 *)CONCAT71(local_1a0._1_7_,local_1a0.has_value_);
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_1a0.contained._8_8_;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_1a0.contained.data.__align;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> TryGetUnderlyingTypeName(const uint32_t tyid) {
  MAPBOX_ETERNAL_CONSTEXPR const auto utynamemap =
      mapbox::eternal::map<uint32_t, mapbox::eternal::string>({
        {TYPE_ID_POINT3H, kHalf3},
        {TYPE_ID_POINT3F, kFloat3},
        {TYPE_ID_POINT3D, kDouble3},
        {TYPE_ID_NORMAL3H, kHalf3},
        {TYPE_ID_NORMAL3F, kFloat3},
        {TYPE_ID_NORMAL3D, kDouble3},
        {TYPE_ID_VECTOR3H, kHalf3},
        {TYPE_ID_VECTOR3F, kFloat3},
        {TYPE_ID_VECTOR3D, kDouble3},
        {TYPE_ID_COLOR3H, kHalf3},
        {TYPE_ID_COLOR3F, kFloat3},
        {TYPE_ID_COLOR3D, kDouble3},
        {TYPE_ID_COLOR4H, kHalf4},
        {TYPE_ID_COLOR4F, kFloat4},
        {TYPE_ID_COLOR4D, kDouble4},
        {TYPE_ID_TEXCOORD2H, kHalf2},
        {TYPE_ID_TEXCOORD2F, kFloat2},
        {TYPE_ID_TEXCOORD2D, kDouble2},
        {TYPE_ID_TEXCOORD3H, kHalf3},
        {TYPE_ID_TEXCOORD3F, kFloat3},
        {TYPE_ID_TEXCOORD3D, kDouble3},
        {TYPE_ID_FRAME4D, kMatrix4d},
  });

  {
  bool array_bit = (TYPE_ID_1D_ARRAY_BIT & tyid);
  uint32_t scalar_tid = tyid & (~TYPE_ID_1D_ARRAY_BIT);

  auto ret = utynamemap.find(scalar_tid);
  if (ret != utynamemap.end()) {
    std::string s = ret->second.c_str();
    if (array_bit) {
      s += "[]";
    }
    return std::move(s);
  }
  }

  return TryGetTypeName(tyid);

}